

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_file_puts(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  undefined1 auVar1 [16];
  size_t in_RAX;
  FILE *__s;
  char *ptr;
  ulong uVar2;
  ulong uVar3;
  JSValue val1;
  ulong uStack_40;
  size_t len;
  
  uStack_40 = 6;
  __s = _stdout;
  len = in_RAX;
  if ((magic == 0) || (__s = (FILE *)js_std_file_get(ctx,this_val), __s != (FILE *)0x0)) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
      val1.tag = *(int64_t *)((long)&argv->tag + uVar2);
      val1.u.ptr = ((JSValueUnion *)((long)&argv->u + uVar2))->ptr;
      ptr = JS_ToCStringLen(ctx,&len,val1);
      if (ptr == (char *)0x0) {
        uStack_40 = 6;
        goto LAB_0010daa8;
      }
      fwrite(ptr,1,len,__s);
      JS_FreeCString(ctx,ptr);
    }
    uStack_40 = 3;
  }
LAB_0010daa8:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_40;
  return (JSValue)(auVar1 << 0x40);
}

Assistant:

static JSValue js_std_file_puts(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int magic)
{
    FILE *f;
    int i;
    const char *str;
    size_t len;

    if (magic == 0) {
        f = stdout;
    } else {
        f = js_std_file_get(ctx, this_val);
        if (!f)
            return JS_EXCEPTION;
    }
    
    for(i = 0; i < argc; i++) {
        str = JS_ToCStringLen(ctx, &len, argv[i]);
        if (!str)
            return JS_EXCEPTION;
        fwrite(str, 1, len, f);
        JS_FreeCString(ctx, str);
    }
    return JS_UNDEFINED;
}